

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::dump(APInt *this)

{
  raw_ostream *prVar1;
  undefined1 local_80 [8];
  SmallString<40U> U;
  SmallString<40U> S;
  APInt *this_local;
  
  SmallString<40U>::SmallString
            ((SmallString<40U> *)
             (U.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.InlineElts + 0x20))
  ;
  SmallString<40U>::SmallString((SmallString<40U> *)local_80);
  toStringUnsigned(this,(SmallVectorImpl<char> *)local_80,10);
  toStringSigned(this,(SmallVectorImpl<char> *)
                      (U.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.InlineElts
                      + 0x20),10);
  prVar1 = dbgs();
  prVar1 = raw_ostream::operator<<(prVar1,"APInt(");
  prVar1 = raw_ostream::operator<<(prVar1,this->BitWidth);
  prVar1 = raw_ostream::operator<<(prVar1,"b, ");
  prVar1 = raw_ostream::operator<<(prVar1,(SmallVectorImpl<char> *)local_80);
  prVar1 = raw_ostream::operator<<(prVar1,"u ");
  prVar1 = raw_ostream::operator<<
                     (prVar1,(SmallVectorImpl<char> *)
                             (U.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.
                              InlineElts + 0x20));
  raw_ostream::operator<<(prVar1,"s)\n");
  SmallString<40U>::~SmallString((SmallString<40U> *)local_80);
  SmallString<40U>::~SmallString
            ((SmallString<40U> *)
             (U.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.InlineElts + 0x20))
  ;
  return;
}

Assistant:

LLVM_DUMP_METHOD void APInt::dump() const {
  SmallString<40> S, U;
  this->toStringUnsigned(U);
  this->toStringSigned(S);
  dbgs() << "APInt(" << BitWidth << "b, "
         << U << "u " << S << "s)\n";
}